

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O1

void rw::free_managed(void *p)

{
  undefined8 *puVar1;
  
  if (p != (void *)0x0) {
    puVar1 = *(undefined8 **)((long)p + -8);
    *puVar1 = *(undefined8 *)((long)p + -0x10);
    *(undefined8 **)(*(long *)((long)p + -0x10) + 8) = puVar1;
    totalMemoryAllocated = totalMemoryAllocated - *(long *)((long)p + -0x30);
    free(*(void **)((long)p + -0x20));
    return;
  }
  return;
}

Assistant:

void
free_managed(void *p)
{
	MemoryBlock *mem;
	if(p == nil)
		return;
	mem = (MemoryBlock*)((uint8*)p-sizeof(MemoryBlock));
	mem->inAllocList.remove();
	totalMemoryAllocated -= mem->sz;
	free(mem->origPtr);
}